

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

UnknownFieldSet * __thiscall
google::protobuf::Reflection::MutableUnknownFields(Reflection *this,Message *message)

{
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  Reflection *in_RSI;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  *unaff_retaddr;
  Message *in_stack_ffffffffffffffc8;
  undefined8 local_18;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)MutableInternalMetadataWithArena(in_RSI,in_stack_ffffffffffffffc8);
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    local_18 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
               ::
               PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                         (this_00);
  }
  else {
    local_18 = (Container *)
               internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow(unaff_retaddr);
  }
  return &local_18->unknown_fields;
}

Assistant:

UnknownFieldSet* Reflection::MutableUnknownFields(Message* message) const {
  return MutableInternalMetadataWithArena(message)->mutable_unknown_fields();
}